

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  double dVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  RecyclableObject *pRVar8;
  ScriptContext *pSVar9;
  int iVar10;
  Type TVar11;
  int in_stack_00000010;
  Type local_78;
  Type TStack_70;
  JavascriptString *local_68;
  Var result;
  CallInfo callInfo_local;
  double value;
  undefined1 auStack_48 [8];
  ArgumentReader args;
  
  pSVar9 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar9->threadContext,0xc00,pSVar9,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cec986;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_48 = (undefined1  [8])result;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_48,(CallInfo *)&result);
  pSVar9 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x33e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cec986;
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)pSVar9;
  if (((ulong)auStack_48 & 0xffffff) == 0) {
LAB_00cec988:
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ec3c,L"Number.prototype.toString"
              );
  }
  pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
  if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00cec986;
    *puVar5 = 0;
  }
  if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    if ((auStack_48._0_4_ & 0xffffff) == 1) {
LAB_00cec328:
      pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
      pJVar7 = ScriptContext::GetIntegerString((ScriptContext *)args.super_Arguments.Values,pvVar6);
      return pJVar7;
    }
    pvVar6 = Arguments::operator[]((Arguments *)auStack_48,1);
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00cec986;
      *puVar5 = 0;
    }
    if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_48,1);
      if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00cec986;
        *puVar5 = 0;
      }
      if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
        if (!bVar3) goto LAB_00cec986;
        *puVar5 = 0;
      }
      if ((int)pvVar6 == 10) goto LAB_00cec328;
    }
  }
  pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
  BVar4 = GetThisValue(pvVar6,(double *)&callInfo_local);
  if (BVar4 == 0) {
    pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
    if (pvVar6 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cec986;
      *puVar5 = 0;
    }
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00cec986;
      *puVar5 = 0;
    }
    TVar11 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar11 = TypeIds_Number, (ulong)pvVar6 >> 0x32 == 0)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00cec986;
        *puVar5 = 0;
      }
      TVar11 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar11) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00cec986;
        *puVar5 = 0;
      }
    }
    if (TVar11 == TypeIds_HostDispatch) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
      local_78._0_4_ = auStack_48._0_4_;
      local_78._4_4_ = auStack_48._4_4_;
      TStack_70._0_4_ = args.super_Arguments.Info._0_4_;
      TStack_70._4_4_ = args.super_Arguments.Info._4_4_;
      iVar10 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x55])(pRVar8,EntryToString,&local_78,&local_68);
      if (iVar10 != 0) {
        return local_68;
      }
    }
    goto LAB_00cec988;
  }
  iVar10 = 10;
  pSVar9 = (ScriptContext *)args.super_Arguments.Values;
  if (((ulong)auStack_48 & 0xfffffe) == 0) goto LAB_00cec949;
  pvVar6 = Arguments::operator[]((Arguments *)auStack_48,1);
  if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00cec986;
    *puVar5 = 0;
  }
  pSVar9 = (ScriptContext *)args.super_Arguments.Values;
  if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00cec986;
      *puVar5 = 0;
    }
    iVar10 = (int)pvVar6;
    pSVar9 = (ScriptContext *)args.super_Arguments.Values;
    goto LAB_00cec949;
  }
  if (pvVar6 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00cec986;
    *puVar5 = 0;
  }
  if ((ulong)pvVar6 >> 0x32 == 0) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cec986;
      *puVar5 = 0;
    }
    TVar11 = ((pRVar8->type).ptr)->typeId;
    if (0x57 < (int)TVar11) {
      BVar4 = RecyclableObject::IsExternal(pRVar8);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00cec986:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      goto LAB_00cec930;
    }
  }
  else {
LAB_00cec930:
    TVar11 = TypeIds_Number;
  }
  iVar10 = 10;
  if (TVar11 != TypeIds_Undefined) {
    dVar2 = JavascriptConversion::ToInteger_Full(pvVar6,pSVar9);
    iVar10 = (int)dVar2;
  }
LAB_00cec949:
  if (iVar10 == 10) {
    pJVar7 = ToStringRadix10((double)callInfo_local,pSVar9);
  }
  else {
    if (iVar10 - 0x25U < 0xffffffdd) {
      JavascriptError::ThrowRangeError(pSVar9,-0x7ff5ec37,L"Number.prototype.toString");
    }
    pJVar7 = ToStringRadixHelper((double)callInfo_local,iVar10,pSVar9);
  }
  return pJVar7;
}

Assistant:

Var JavascriptNumber::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        // Optimize base 10 of TaggedInt numbers
        if (TaggedInt::Is(args[0]) && (args.Info.Count == 1 || (TaggedInt::Is(args[1]) && TaggedInt::ToInt32(args[1]) == 10)))
        {
            return scriptContext->GetIntegerString(args[0]);
        }

        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toString"));
        }

        int radix = 10;
        if(args.Info.Count > 1)
        {
            //use the first arg as the radix, ignore the rest.
            Var aRadix = args[1];

           // shortcut for tagged int's
            if(TaggedInt::Is(aRadix))
            {
                radix = TaggedInt::ToInt32(aRadix);
            }
            else if(JavascriptOperators::GetTypeId(aRadix) != TypeIds_Undefined)
            {
                radix = (int)JavascriptConversion::ToInteger(aRadix,scriptContext);
            }

        }
        if(10 == radix)
        {
            return ToStringRadix10(value, scriptContext);
        }

        if( radix < 2 || radix >36 )
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_FunctionArgument_Invalid, _u("Number.prototype.toString"));
        }

        return ToStringRadixHelper(value, radix, scriptContext);
    }